

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall TPZVec<long>::Fill(TPZVec<long> *this,long *copy,int64_t from,int64_t numelem)

{
  long lVar1;
  long *plVar2;
  int64_t i;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  
  if (numelem < -1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"TPZVec::Fill");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"It\'s negative parameter numelem, then numelem = ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::ostream::flush();
  }
  lVar4 = 0;
  if (0 < from) {
    lVar4 = from;
  }
  lVar1 = this->fNElements;
  if (lVar1 <= lVar4) {
    lVar4 = lVar1;
  }
  plVar2 = this->fStore;
  if (numelem < 0) {
    numelem = lVar1;
  }
  lVar5 = numelem + from;
  if (lVar1 <= numelem + from) {
    lVar5 = lVar1;
  }
  for (; lVar4 < lVar5; lVar4 = lVar4 + 1) {
    plVar2[lVar4] = *copy;
  }
  return;
}

Assistant:

void TPZVec<T>::Fill(const T& copy, const int64_t from, const int64_t numelem){
#ifndef PZNODEBUG
	if(numelem<0 && numelem != -1) {
		PZError << "TPZVec::Fill" << std::endl
		<< "It's negative parameter numelem, then numelem = "
		<< fNElements << std::endl;
		
		PZError.flush();
	}
#endif
	
	int64_t first = (from < 0) ? 0 : from;
	int64_t nel = numelem;
	first = (first > fNElements) ? fNElements : first;
	if (nel < 0) nel = fNElements;
	int64_t last = (from+nel > fNElements) ? fNElements : from+nel;
	
	for(int64_t i=first; i<last; i++)
		fStore[i] = copy;
}